

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getInfoType(void *highs,char *info,HighsInt *type)

{
  HighsStatus HVar1;
  undefined4 *in_RDX;
  Highs *in_RSI;
  string *in_RDI;
  HighsInt retcode;
  HighsInfoType t;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  allocator local_41;
  string local_40 [36];
  undefined4 local_1c;
  undefined4 *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)in_RSI,&local_41);
  HVar1 = Highs::getInfoType(in_RSI,in_RDI,
                             (HighsInfoType *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *local_18 = local_1c;
  return HVar1;
}

Assistant:

HighsInt Highs_getInfoType(const void* highs, const char* info,
                           HighsInt* type) {
  HighsInfoType t;
  HighsInt retcode =
      (HighsInt)((Highs*)highs)->getInfoType(std::string(info), t);
  *type = (HighsInt)t;
  return retcode;
}